

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shake256_impl.c
# Opt level: O0

int sprng256_next(keccak_sponge *sponge,uint8_t *entropy,size_t entropylen)

{
  ulong in_RDX;
  void *in_RSI;
  size_t in_RDI;
  int err;
  keccak_sponge *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (in_RDI == 0) {
    iVar1 = -1;
  }
  else if (in_RSI == (void *)0x0) {
    iVar1 = -1;
  }
  else if (in_RDX < 0x8000000000000000) {
    if (*(long *)(in_RDI + 0xd0) == -0x40fbdf7862560d27) {
      _sponge_absorb(unaff_retaddr,
                     (uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI
                    );
      memset(in_RSI,0,in_RDX);
      iVar1 = sprng256_forget((keccak_sponge *)
                              CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    }
    else {
      iVar1 = 2;
    }
  }
  else {
    iVar1 = -2;
  }
  return iVar1;
}

Assistant:

int sprng256_next(keccak_sponge* const __restrict sponge,
                  uint8_t* const entropy,
                  const size_t entropylen) {
  if (sponge == NULL) {
    return SPONGERR_NULL;
  }
  if (entropy == NULL) {
    return SPONGERR_NULL;
  }
  if (entropylen > (SIZE_MAX >> 1)) {
    return SPONGERR_RSIZE;
  }
  if (sponge->flags != FLAG_SPONGEPRG) {
    return SPONGERR_NOTINIT;
  }

  _sponge_absorb(sponge, entropy, entropylen);  // Absorb the entropy,
  memset(entropy, 0, entropylen);               // zeroize the buffer,

  int err = sprng256_forget(sponge);  // And prevent baktracking.

  return err;
}